

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O3

void __thiscall spdlog::details::file_helper::flush(file_helper *this)

{
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  iVar1 = fflush((FILE *)this->fd_);
  if (iVar1 == 0) {
    return;
  }
  os::filename_to_str(&local_30,&this->filename_);
  std::operator+(&local_50,"Failed flush to file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  piVar2 = __errno_location();
  throw_spdlog_ex((string *)&local_50,*piVar2);
}

Assistant:

SPDLOG_INLINE void file_helper::flush() {
    if (std::fflush(fd_) != 0) {
        throw_spdlog_ex("Failed flush to file " + os::filename_to_str(filename_), errno);
    }
}